

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

int xmlSchemaValidateFacet
              (xmlSchemaTypePtr base,xmlSchemaFacetPtr facet,xmlChar *value,xmlSchemaValPtr val)

{
  int iVar1;
  xmlSchemaValType valType;
  
  if (val == (xmlSchemaValPtr)0x0) {
    if (base == (xmlSchemaTypePtr)0x0) {
      return -1;
    }
    valType = base->builtInType;
    val = (xmlSchemaValPtr)0x0;
  }
  else {
    valType = val->type;
  }
  iVar1 = xmlSchemaValidateFacetInternal
                    (facet,XML_SCHEMA_WHITESPACE_UNKNOWN,valType,value,val,
                     XML_SCHEMA_WHITESPACE_UNKNOWN);
  return iVar1;
}

Assistant:

int
xmlSchemaValidateFacet(xmlSchemaTypePtr base,
	               xmlSchemaFacetPtr facet,
	               const xmlChar *value,
		       xmlSchemaValPtr val)
{
    /*
    * This tries to ensure API compatibility regarding the old
    * xmlSchemaValidateFacet() and the new xmlSchemaValidateFacetInternal() and
    * xmlSchemaValidateFacetWhtsp().
    */
    if (val != NULL)
	return(xmlSchemaValidateFacetInternal(facet,
	    XML_SCHEMA_WHITESPACE_UNKNOWN, val->type, value, val,
	    XML_SCHEMA_WHITESPACE_UNKNOWN));
    else if (base != NULL)
	return(xmlSchemaValidateFacetInternal(facet,
	    XML_SCHEMA_WHITESPACE_UNKNOWN, base->builtInType, value, val,
	    XML_SCHEMA_WHITESPACE_UNKNOWN));
    return(-1);
}